

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn_lex.cpp
# Opt level: O1

string * __thiscall util::Lexer::ReadValue_abi_cxx11_(string *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  char c;
  char local_61;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  code *local_58 [2];
  code *local_48;
  code *pcStack_40;
  
  local_61 = '\0';
  local_60 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_60;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::istream::get((char *)this->is);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  while( true ) {
    local_58[1] = (code *)0x0;
    local_58[0] = ctype_value;
    pcStack_40 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_invoke;
    local_48 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_manager;
    bVar1 = GetCharIf(this,&local_61,(function<bool_(char)> *)local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
    }
    if (!bVar1) break;
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Lexer::ReadValue()
	{
		char c = '\0';
		std::string s;

		this->GetChar(c);
		s += c;

		while (this->GetCharIf(c, ctype_value))
		{
			s += c;
		}

		return s;
	}